

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::apply
          (QControlledGate2<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000084;
  complex<float> *vector_00;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_40_5_d6c92a71_conflict f;
  undefined1 local_80 [8];
  void *local_78;
  int *local_70 [2];
  long local_60;
  anon_class_40_5_d6c92a71_conflict local_58;
  
  vector_00 = (complex<float> *)CONCAT44(in_register_00000084,offset);
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (local_70,this);
  *local_70[0] = *local_70[0] + offset;
  local_70[0][1] = local_70[0][1] + offset;
  iVar1 = this->control_;
  iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[0xf])(this);
  iVar3 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[0x10])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
            (local_80,(long *)CONCAT44(extraout_var,iVar3));
  lambda_QGate1<std::complex<float>>
            (&local_58,(qgates *)(ulong)(uint)(int)(char)op,(Op)local_80,
             (SquareMatrix<std::complex<float>_> *)
             (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start,vector_00);
  if (local_78 != (void *)0x0) {
    operator_delete__(local_78);
  }
  local_78 = (void *)0x0;
  apply4<qclab::qgates::lambda_QGate1<std::complex<float>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<float>>,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_70[0],local_70[0][1],iVar1 + offset,iVar2 + offset,this->controlState_,
             &local_58);
  if (local_70[0] != (int *)0x0) {
    operator_delete(local_70[0],local_60 - (long)local_70[0]);
  }
  return;
}

Assistant:

void QControlledGate2< T >::apply( Op op ,
                                     const int nbQubits ,
                                     std::vector< T >& vector ,
                                     const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_QGate1( op , this->gate()->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }